

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O0

FOptionalMapinfoData * __thiscall FEDOptions::Clone(FEDOptions *this)

{
  FEDOptions *this_00;
  FEDOptions *newopt;
  FEDOptions *this_local;
  
  this_00 = (FEDOptions *)operator_new(0x28);
  FEDOptions(this_00);
  FName::operator=(&(this_00->super_FOptionalMapinfoData).identifier,
                   &(this->super_FOptionalMapinfoData).identifier);
  FString::operator=(&this_00->EDName,&this->EDName);
  FString::operator=(&this_00->acsName,&this->acsName);
  return &this_00->super_FOptionalMapinfoData;
}

Assistant:

virtual FOptionalMapinfoData *Clone() const
	{
		FEDOptions *newopt = new FEDOptions;
		newopt->identifier = identifier;
		newopt->EDName = EDName;
		newopt->acsName = acsName;
		return newopt;
	}